

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_unk(Parser *this)

{
  Tree *pTVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  long lVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  State *pSVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t len_;
  char *pcVar19;
  ulong uVar20;
  ro_substr chars;
  ro_substr chars_00;
  csubstr fmt;
  csubstr fmt_00;
  ro_substr chars_01;
  ro_substr chars_02;
  csubstr rem;
  csubstr fmt_01;
  ro_substr chars_03;
  csubstr cVar21;
  bool is_quoted;
  basic_substring<const_char> trimmed;
  char msg [39];
  basic_substring<const_char> local_108;
  bool local_e9;
  basic_substring<const_char> local_e8;
  basic_substring<const_char> local_d8;
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pSVar13 = this->m_state;
  local_108.str = (pSVar13->line_contents).rem.str;
  local_108.len = (pSVar13->line_contents).rem.len;
  if (pSVar13->node_id == 0xffffffffffffffff) {
    bVar8 = true;
  }
  else {
    pTVar1 = this->m_tree;
    if (pTVar1->m_cap <= pSVar13->node_id) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      local_d8.str = (char *)0x0;
      local_d8.len = 0x4b74;
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x29;
      local_c8[9] = '\r';
      local_c8[10] = ' ';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = 0x65;
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = 0;
      (*(code *)PTR_error_impl_00243548)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    bVar8 = pTVar1->m_buf == (NodeData *)0x0;
  }
  if ((this->m_state->flags & 0x1000) != 0) {
    iVar11 = basic_substring<const_char>::compare(&local_108,"---",3);
    if (iVar11 == 0) {
LAB_001d7039:
      cVar21.len = local_108.len;
      cVar21.str = local_108.str;
      _start_new_doc(this,cVar21);
      return true;
    }
    if ((3 < local_108.len) && (*local_108.str == '-')) {
      uVar20 = 0;
      do {
        uVar17 = uVar20;
        if (uVar17 == 3) break;
        uVar20 = uVar17 + 1;
      } while (local_108.str[uVar17 + 1] == "--- "[uVar17 + 1]);
      if (2 < uVar17) goto LAB_001d7039;
    }
    local_e8 = basic_substring<const_char>::triml(&local_108,' ');
    uVar20 = local_e8.len;
    pcVar14 = local_e8.str;
    iVar11 = basic_substring<const_char>::compare(&local_e8,"---",3);
    if (iVar11 == 0) {
LAB_001d70ff:
      if (local_108.len < uVar20) {
        builtin_strncpy(local_c8,"em.len >= trimmed.len)",0x17);
        local_d8.str = (char *)0x6166206b63656863;
        local_d8.len._0_1_ = 'i';
        local_d8.len._1_1_ = 'l';
        local_d8.len._2_1_ = 'e';
        local_d8.len._3_1_ = 'd';
        local_d8.len._4_1_ = ':';
        local_d8.len._5_1_ = ' ';
        local_d8.len._6_1_ = '(';
        local_d8.len._7_1_ = 'r';
        if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          uVar9 = (*pcVar2)();
          return (bool)uVar9;
        }
        local_58 = 0;
        uStack_50 = 0x6c35;
        local_48 = 0;
        pcStack_40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_38 = 0x65;
        auVar4 = ZEXT1224(ZEXT412(0x6c35) << 0x40);
        LVar5.name.str._0_4_ = 0x200dd7;
        LVar5.super_LineCol.offset = auVar4._0_8_;
        LVar5.super_LineCol.line = auVar4._8_8_;
        LVar5.super_LineCol.col = auVar4._16_8_;
        LVar5.name.str._4_4_ = 0;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_d8,0x27,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      _line_progressed(this,local_108.len - local_e8.len);
      _start_new_doc(this,local_e8);
      _save_indentation(this,0);
      return true;
    }
    if ((3 < uVar20) && (*pcVar14 == '-')) {
      uVar17 = 0;
      do {
        uVar16 = uVar17;
        if (uVar16 == 3) break;
        uVar17 = uVar16 + 1;
      } while (pcVar14[uVar16 + 1] == "--- "[uVar16 + 1]);
      if (2 < uVar16) goto LAB_001d70ff;
    }
    if ((uVar20 < 3) || (*pcVar14 != '.')) {
LAB_001d72a8:
      chars_03.len = 2;
      chars_03.str = "#%";
      sVar12 = basic_substring<const_char>::first_of(&local_e8,chars_03,0);
      if (sVar12 == 0xffffffffffffffff) {
        sVar12 = this->m_state->indref;
        _push_level(this,false);
        _start_doc(this,true);
        this->m_state->indref = sVar12;
      }
    }
    else {
      uVar20 = 0;
      do {
        uVar17 = uVar20;
        if (uVar17 == 2) break;
        uVar20 = uVar17 + 1;
      } while (pcVar14[uVar17 + 1] == "\t..."[uVar17 + 2]);
      if (uVar17 < 2) goto LAB_001d72a8;
      _end_stream(this);
    }
    if ((local_e8.len == 0) || (local_e8.str == (char *)0x0)) {
      builtin_strncpy(local_c8,"trimmed.empty())",0x11);
      local_d8.str = (char *)0x6166206b63656863;
      local_d8.len._0_1_ = 'i';
      local_d8.len._1_1_ = 'l';
      local_d8.len._2_1_ = 'e';
      local_d8.len._3_1_ = 'd';
      local_d8.len._4_1_ = ':';
      local_d8.len._5_1_ = ' ';
      local_d8.len._6_1_ = '(';
      local_d8.len._7_1_ = '!';
      if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      local_80 = 0;
      uStack_78 = 0x6c47;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6c47) << 0x40);
      LVar6.name.str._0_4_ = 0x200dd7;
      LVar6.super_LineCol.offset = auVar4._0_8_;
      LVar6.super_LineCol.line = auVar4._8_8_;
      LVar6.super_LineCol.col = auVar4._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_d8,0x21,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  if ((this->m_state->flags & 0x10c) != 0) {
    builtin_strncpy(local_c8,"as_none(RNXT|RSEQ|RMAP))",0x19);
    local_d8.str = (char *)0x6166206b63656863;
    local_d8.len._0_1_ = 'i';
    local_d8.len._1_1_ = 'l';
    local_d8.len._2_1_ = 'e';
    local_d8.len._3_1_ = 'd';
    local_d8.len._4_1_ = ':';
    local_d8.len._5_1_ = ' ';
    local_d8.len._6_1_ = '(';
    local_d8.len._7_1_ = 'h';
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar2 = (code *)swi(3);
      uVar9 = (*pcVar2)();
      return (bool)uVar9;
    }
    local_a8 = 0;
    uStack_a0 = 0x6c4a;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x6c4a) << 0x40);
    LVar3.name.str._0_4_ = 0x200dd7;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_d8,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  if (this->m_state->indref != 0) {
    sVar12 = basic_substring<const_char>::first_not_of(&local_108,' ',0);
    if ((sVar12 != 0xffffffffffffffff) && (local_108.len < sVar12)) {
      if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar2 = (code *)swi(3);
        uVar9 = (*pcVar2)();
        return (bool)uVar9;
      }
      handle_error(0x200e84,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar12 == 0xffffffffffffffff) {
      local_d8.str = local_108.str;
      local_d8.len = local_108.len;
    }
    else {
      basic_substring<const_char>::basic_substring(&local_d8,local_108.str,sVar12);
    }
    sVar12 = this->m_state->indref;
    if (sVar12 <= local_d8.len) {
      _line_progressed(this,sVar12);
      uVar20 = this->m_state->indref;
      if (local_108.len < uVar20) {
        if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar2 = (code *)swi(3);
          uVar9 = (*pcVar2)();
          return (bool)uVar9;
        }
        handle_error(0x200e84,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_d8,local_108.str + uVar20,local_108.len - uVar20);
      local_108.str = local_d8.str;
      local_108.len = local_d8.len;
    }
  }
  sVar12 = local_108.len;
  if ((1 < local_108.len) && (*local_108.str == '-')) {
    lVar7 = 0;
    do {
      lVar18 = lVar7;
      if (lVar18 == 1) break;
      lVar7 = lVar18 + 1;
    } while (local_108.str[lVar18 + 1] == "--- "[lVar18 + 3]);
    if (lVar18 == 0) goto LAB_001d63d7;
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,false);
    _start_seq(this,bVar8);
LAB_001d6634:
    _save_indentation(this,0);
    sVar12 = 2;
    goto LAB_001d6646;
  }
LAB_001d63d7:
  iVar11 = basic_substring<const_char>::compare(&local_108,'-');
  if (iVar11 == 0) {
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,false);
    _start_seq(this,bVar8);
LAB_001d64d8:
    _save_indentation(this,0);
  }
  else {
    if (sVar12 == 0) {
LAB_001d657c:
      if (1 < sVar12) {
        if (*local_108.str == '?') {
          lVar7 = 0;
          do {
            lVar18 = lVar7;
            if (lVar18 == 1) break;
            lVar7 = lVar18 + 1;
          } while (local_108.str[lVar18 + 1] == "? "[lVar18 + 1]);
          if (lVar18 == 0) goto LAB_001d6662;
          _move_key_anchor_to_val_anchor(this);
          if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
            sVar12 = (this->m_key_tag).len;
            (this->m_val_tag).str = (this->m_key_tag).str;
            (this->m_val_tag).len = sVar12;
            this->m_val_tag_indentation = this->m_key_tag_indentation;
            (this->m_key_tag).str = (char *)0x0;
            (this->m_key_tag).len = 0;
            this->m_key_tag_indentation = 0;
          }
          _push_level(this,false);
          _start_map(this,bVar8);
          pSVar13 = this->m_state;
          uVar15 = pSVar13->flags & 0xffffff1fU | 0x60;
LAB_001d6632:
          pSVar13->flags = uVar15;
          goto LAB_001d6634;
        }
LAB_001d6662:
        if ((1 < sVar12) && (*local_108.str == ':')) {
          lVar7 = 0;
          do {
            lVar18 = lVar7;
            if (lVar18 == 1) break;
            lVar7 = lVar18 + 1;
          } while (local_108.str[lVar18 + 1] == "\": "[lVar18 + 2]);
          if ((lVar18 != 0) && ((this->m_state->flags & 0x200) == 0)) {
            _move_key_anchor_to_val_anchor(this);
            if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
              sVar12 = (this->m_key_tag).len;
              (this->m_val_tag).str = (this->m_key_tag).str;
              (this->m_val_tag).len = sVar12;
              this->m_val_tag_indentation = this->m_key_tag_indentation;
              (this->m_key_tag).str = (char *)0x0;
              (this->m_key_tag).len = 0;
              this->m_key_tag_indentation = 0;
            }
            _push_level(this,false);
            _start_map(this,bVar8);
            _store_scalar_null(this,local_108.str);
            pSVar13 = this->m_state;
            uVar15 = pSVar13->flags & 0xffffff3fU | 0x80;
            goto LAB_001d6632;
          }
        }
      }
      iVar11 = basic_substring<const_char>::compare(&local_108,':');
      if ((iVar11 == 0) && ((this->m_state->flags & 0x200) == 0)) {
        _move_key_anchor_to_val_anchor(this);
        if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
          sVar12 = (this->m_key_tag).len;
          (this->m_val_tag).str = (this->m_key_tag).str;
          (this->m_val_tag).len = sVar12;
          this->m_val_tag_indentation = this->m_key_tag_indentation;
          (this->m_key_tag).str = (char *)0x0;
          (this->m_key_tag).len = 0;
          this->m_key_tag_indentation = 0;
        }
        _push_level(this,false);
        _start_map(this,bVar8);
        _store_scalar_null(this,local_108.str);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
        goto LAB_001d64d8;
      }
      bVar10 = _handle_types(this);
      if (bVar10) {
        return true;
      }
      if (((local_108.len == 0) || (*local_108.str != '*')) &&
         (bVar10 = _handle_key_anchors_and_refs(this), bVar10)) {
        return true;
      }
      if ((this->m_state->flags & 0x200) == 0) {
        local_e8 = (basic_substring<const_char>)ZEXT816(0);
        uVar20 = (this->m_state->line_contents).indentation;
        bVar10 = _scan_scalar_unk(this,&local_e8,&local_e9);
        if (bVar10) {
          local_108.str = (this->m_state->line_contents).rem.str;
          local_108.len = (this->m_state->line_contents).rem.len;
          chars.len = 2;
          chars.str = " \t";
          sVar12 = basic_substring<const_char>::first_not_of(&local_108,chars,0);
          if (sVar12 - 1 < 0xfffffffffffffffe) {
            _line_progressed(this,sVar12);
            if (local_108.len < sVar12) {
              if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_d8,local_108.str + sVar12,local_108.len - sVar12);
            local_108.str = local_d8.str;
            local_108.len = local_d8.len;
          }
          _store_scalar(this,local_e8,(uint)local_e9);
          if ((local_108.len < 2) || (*local_108.str != ':')) {
LAB_001d6926:
            sVar12 = 1;
            iVar11 = basic_substring<const_char>::compare(&local_108,":",1);
            if (iVar11 != 0) {
              return true;
            }
          }
          else {
            lVar7 = 0;
            do {
              lVar18 = lVar7;
              if (lVar18 == 1) break;
              lVar7 = lVar18 + 1;
            } while (local_108.str[lVar18 + 1] == "\": "[lVar18 + 2]);
            sVar12 = 2;
            if (lVar18 == 0) goto LAB_001d6926;
          }
          _push_level(this,false);
          _start_map(this,bVar8);
          pSVar13 = this->m_state;
        }
        else {
          if (local_108.len == 0) {
            return false;
          }
          if (*local_108.str != ' ') {
            lVar7 = 0;
            do {
              lVar18 = lVar7;
              if (lVar18 == 1) break;
              lVar7 = lVar18 + 1;
            } while (*local_108.str != " \t"[lVar18 + 1]);
            if (lVar18 != 0) {
              return false;
            }
          }
          chars_01.len = 2;
          chars_01.str = " \t";
          sVar12 = basic_substring<const_char>::first_not_of(&local_108,chars_01,0);
          if ((sVar12 != 0xffffffffffffffff) && (local_108.len < sVar12)) {
            if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar2 = (code *)swi(3);
              uVar9 = (*pcVar2)();
              return (bool)uVar9;
            }
            handle_error(0x200e84,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar12 == 0xffffffffffffffff) {
            local_d8.str = local_108.str;
            local_d8.len = local_108.len;
          }
          else {
            basic_substring<const_char>::basic_substring(&local_d8,local_108.str,sVar12);
          }
          sVar12 = local_d8.len;
          if (local_108.len == 0) {
            if (local_d8.len == 0) {
              bVar8 = local_108.str != (char *)0x0 && local_108.str == local_d8.str;
              goto LAB_001d6e4f;
            }
LAB_001d6e53:
            if (local_d8.str != (char *)0x0 && local_d8.len != 0) {
              if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x159e,"is_super(subs) || subs.empty()");
            }
          }
          else {
            bVar8 = local_d8.str + local_d8.len <= local_108.str + local_108.len &&
                    local_108.str <= local_d8.str;
LAB_001d6e4f:
            if (!bVar8) goto LAB_001d6e53;
          }
          pcVar19 = local_d8.str + local_d8.len;
          pcVar14 = local_108.str + local_108.len;
          uVar20 = (long)pcVar19 - (long)local_108.str;
          if (pcVar14 < pcVar19 || pcVar19 < local_108.str) {
            local_108.len = 0;
          }
          else {
            if (local_108.len < uVar20) {
              if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153a,"first >= 0 && first <= len");
            }
            uVar17 = (long)pcVar14 - (long)pcVar19;
            if ((uVar17 != 0xffffffffffffffff) && (local_108.len < uVar17)) {
              if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
            }
            len_ = local_108.len - uVar20;
            if (uVar17 != 0xffffffffffffffff) {
              len_ = uVar17;
            }
            if ((pcVar14 != pcVar19) && (local_108.len < len_ + uVar20)) {
              if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
            }
            basic_substring<const_char>::basic_substring(&local_d8,local_108.str + uVar20,len_);
            local_108.str = local_d8.str;
            local_108.len = local_d8.len;
          }
          pSVar13 = this->m_state;
          if ((local_108.len < 3 || (pSVar13->flags & 1) == 0) || (*local_108.str != '-'))
          goto LAB_001d6646;
          uVar20 = 0;
          do {
            uVar17 = uVar20;
            if (uVar17 == 2) break;
            uVar20 = uVar17 + 1;
          } while (local_108.str[uVar17 + 1] == "---"[uVar17 + 1]);
          uVar20 = sVar12;
          if (uVar17 < 2) goto LAB_001d6646;
        }
        pSVar13->indref = uVar20;
        goto LAB_001d6646;
      }
      local_e8 = (basic_substring<const_char>)ZEXT816(0);
      bVar10 = _scan_scalar_unk(this,&local_e8,&local_e9);
      if (bVar10) {
        local_108.str = (this->m_state->line_contents).rem.str;
        local_108.len = (this->m_state->line_contents).rem.len;
        if (local_108.len != 0) {
          if (*local_108.str != ' ') {
            lVar7 = 0;
            do {
              lVar18 = lVar7;
              if (lVar18 == 1) break;
              lVar7 = lVar18 + 1;
            } while (*local_108.str != " \t"[lVar18 + 1]);
            if (lVar18 != 0) goto LAB_001d6a38;
          }
          chars_00.len = 2;
          chars_00.str = " \t";
          sVar12 = basic_substring<const_char>::first_not_of(&local_108,chars_00,0);
          if (local_108.len < sVar12) {
            if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar2 = (code *)swi(3);
              uVar9 = (*pcVar2)();
              return (bool)uVar9;
            }
            handle_error(0x200e84,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_d8,local_108.str + sVar12,local_108.len - sVar12);
          local_108.str = local_d8.str;
          local_108.len = local_d8.len;
          _line_progressed(this,sVar12);
        }
      }
LAB_001d6a38:
      sVar12 = local_108.len;
      if ((local_108.len < 2) || (*local_108.str != ',')) {
LAB_001d6aa4:
        if ((local_108.len == 0) || (*local_108.str != ',')) {
          if ((1 < local_108.len) && (*local_108.str == ':')) {
            lVar7 = 0;
            do {
              lVar18 = lVar7;
              if (lVar18 == 1) break;
              lVar7 = lVar18 + 1;
            } while (local_108.str[lVar18 + 1] == "\": "[lVar18 + 2]);
            if (lVar18 != 0) {
              _start_map_unk(this,bVar8);
              goto LAB_001d6b2e;
            }
          }
          iVar11 = basic_substring<const_char>::compare(&local_108,":",1);
          if (iVar11 == 0) {
LAB_001d6c03:
            _start_map_unk(this,bVar8);
          }
          else {
            if (1 < sVar12) {
              if (*local_108.str == ':') {
                lVar7 = 0;
                do {
                  lVar18 = lVar7;
                  if (lVar18 == 1) break;
                  lVar7 = lVar18 + 1;
                } while (local_108.str[lVar18 + 1] == ":\""[lVar18 + 1]);
                if (lVar18 != 0) goto LAB_001d6c03;
              }
              if ((1 < sVar12) && (*local_108.str == ':')) {
                lVar7 = 0;
                do {
                  lVar18 = lVar7;
                  if (lVar18 == 1) break;
                  lVar7 = lVar18 + 1;
                } while (local_108.str[lVar18 + 1] == "\':\'"[lVar18 + 2]);
                if (lVar18 != 0) goto LAB_001d6c03;
              }
            }
            if ((sVar12 == 0) || (*local_108.str != '}')) {
              if ((2 < sVar12) && (*local_108.str == '.')) {
                uVar20 = 0;
                do {
                  uVar17 = uVar20;
                  if (uVar17 == 2) break;
                  uVar20 = uVar17 + 1;
                } while (local_108.str[uVar17 + 1] == "\t..."[uVar17 + 2]);
                if (1 < uVar17) {
                  _end_stream(this);
                  sVar12 = 3;
                  goto LAB_001d6cb6;
                }
              }
              if ((sVar12 != 0) && (*local_108.str == '#')) {
                _scan_comment(this);
                return true;
              }
              bVar8 = _handle_key_anchors_and_refs(this);
              sVar12 = local_108.len;
              pcVar14 = local_108.str;
              if (bVar8) {
                return true;
              }
              if ((local_108.len != 0) &&
                 ((*local_108.str == ' ' || ((local_108.len != 0 && (*local_108.str == '\t')))))) {
                chars_02.len = 2;
                chars_02.str = " \t";
                sVar12 = basic_substring<const_char>::first_not_of(&local_108,chars_02,0);
                if (sVar12 == 0xffffffffffffffff) {
                  sVar12 = local_108.len;
                }
LAB_001d6e09:
                _line_progressed(this,sVar12);
                return true;
              }
              if (local_108.str != (char *)0x0 && local_108.len != 0) {
                iVar11 = basic_substring<const_char>::compare(&local_108,"---",3);
                if (iVar11 == 0) {
LAB_001d6fce:
                  rem.len = sVar12;
                  rem.str = pcVar14;
                  _start_new_doc(this,rem);
                  return true;
                }
                if ((3 < sVar12) && (*pcVar14 == '-')) {
                  uVar20 = 0;
                  do {
                    uVar17 = uVar20;
                    if (uVar17 == 3) break;
                    uVar20 = uVar17 + 1;
                  } while (pcVar14[uVar17 + 1] == "--- "[uVar17 + 1]);
                  if (2 < uVar17) goto LAB_001d6fce;
                }
                if (*pcVar14 == '%') goto LAB_001d6e09;
                bVar8 = is_debugger_attached();
                if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                  pcVar2 = (code *)swi(3);
                  uVar9 = (*pcVar2)();
                  return (bool)uVar9;
                }
                fmt_01.len = 0x12;
                fmt_01.str = "ERROR: parse error";
                _err<>(this,fmt_01);
              }
              goto LAB_001d6cbe;
            }
            if ((~this->m_state->flags & 0x14U) != 0) {
              bVar8 = is_debugger_attached();
              if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              fmt.len = 0x27;
              fmt.str = "ERROR: invalid token: not reading a map";
              _err<>(this,fmt);
            }
            if ((this->m_state->flags & 0x200) == 0) {
              bVar8 = is_debugger_attached();
              if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar2 = (code *)swi(3);
                uVar9 = (*pcVar2)();
                return (bool)uVar9;
              }
              fmt_00.len = 0x17;
              fmt_00.str = "ERROR: no scalar stored";
              _err<>(this,fmt_00);
            }
            _append_key_val(this,local_e8,0);
            _stop_map(this);
          }
        }
        else {
          _start_seq(this,bVar8);
          this->m_state->flags = this->m_state->flags | 0x10;
          cVar21 = _consume_scalar(this);
          _append_val(this,cVar21,0);
        }
        sVar12 = 1;
      }
      else {
        lVar7 = 0;
        do {
          lVar18 = lVar7;
          if (lVar18 == 1) break;
          lVar7 = lVar18 + 1;
        } while (local_108.str[lVar18 + 1] == " not within [0, "[lVar18 + 0xf]);
        if (lVar18 == 0) goto LAB_001d6aa4;
        _start_seq(this,bVar8);
        this->m_state->flags = this->m_state->flags | 0x10;
        cVar21 = _consume_scalar(this);
        _append_val(this,cVar21,0);
LAB_001d6b2e:
        sVar12 = 2;
      }
LAB_001d6cb6:
      _line_progressed(this,sVar12);
LAB_001d6cbe:
      if (local_e8.str != (char *)0x0 && local_e8.len != 0) {
        _store_scalar(this,local_e8,(uint)local_e9);
        return true;
      }
      return true;
    }
    if (*local_108.str == '[') {
      _move_key_anchor_to_val_anchor(this);
      if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
        sVar12 = (this->m_key_tag).len;
        (this->m_val_tag).str = (this->m_key_tag).str;
        (this->m_val_tag).len = sVar12;
        this->m_val_tag_indentation = this->m_key_tag_indentation;
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
        this->m_key_tag_indentation = 0;
      }
      _push_level(this,true);
      _start_seq(this,bVar8);
      this->m_state->flags = this->m_state->flags | 0x10;
    }
    else {
      if ((sVar12 == 0) || (*local_108.str != '{')) goto LAB_001d657c;
      _move_key_anchor_to_val_anchor(this);
      if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
        sVar12 = (this->m_key_tag).len;
        (this->m_val_tag).str = (this->m_key_tag).str;
        (this->m_val_tag).len = sVar12;
        this->m_val_tag_indentation = this->m_key_tag_indentation;
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
        this->m_key_tag_indentation = 0;
      }
      _push_level(this,true);
      _start_map(this,bVar8);
      this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
    }
  }
  sVar12 = 1;
LAB_001d6646:
  _line_progressed(this,sVar12);
  return true;
}

Assistant:

bool Parser::_handle_unk()
{
    _c4dbgp("handle_unk");

    csubstr rem = m_state->line_contents.rem;
    const bool start_as_child = (node(m_state) == nullptr);

    if(C4_UNLIKELY(has_any(NDOC)))
    {
        if(rem == "---" || rem.begins_with("--- "))
        {
            _start_new_doc(rem);
            return true;
        }
        auto trimmed = rem.triml(' ');
        if(trimmed == "---" || trimmed.begins_with("--- "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len >= trimmed.len);
            _line_progressed(rem.len - trimmed.len);
            _start_new_doc(trimmed);
            _save_indentation();
            return true;
        }
        else if(trimmed.begins_with("..."))
        {
            _end_stream();
        }
        else if(trimmed.first_of("#%") == csubstr::npos) // neither a doc nor a tag
        {
            _c4dbgpf("starting implicit doc to accomodate unexpected tokens: '{}'", rem);
            size_t indref = m_state->indref;
            _push_level();
            _start_doc();
            _set_indentation(indref);
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, !trimmed.empty());
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT|RSEQ|RMAP));
    if(m_state->indref > 0)
    {
        csubstr ws = rem.left_of(rem.first_not_of(' '));
        if(m_state->indref <= ws.len)
        {
            _c4dbgpf("skipping base indentation of {}", m_state->indref);
            _line_progressed(m_state->indref);
            rem = rem.sub(m_state->indref);
        }
    }

    if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == '-')
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('['))
    {
        _c4dbgpf("it's a seq, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_seq(start_as_child);
        add_flags(FLOW);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('{'))
    {
        _c4dbgpf("it's a map, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_map(start_as_child);
        addrem_flags(FLOW|RKEY, RVAL);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with("? "))
    {
        _c4dbgpf("it's a map (as_child={}) + this key is complex", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        addrem_flags(RKEY|QMRK, RVAL);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem.begins_with(": ") && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == ':' && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(_handle_types())
    {
        return true;
    }
    else if(!rem.begins_with('*') && _handle_key_anchors_and_refs())
    {
        return true;
    }
    else if(has_all(SSCL))
    {
        _c4dbgpf("there's a stored scalar: '{}'", m_state->scalar);

        csubstr saved_scalar;
        bool is_quoted;
        if(_scan_scalar_unk(&saved_scalar, &is_quoted))
        {
            rem = m_state->line_contents.rem;
            _c4dbgpf("... and there's also a scalar next! '{}'", saved_scalar);
            if(rem.begins_with_any(" \t"))
            {
                size_t n = rem.first_not_of(" \t");
                _c4dbgpf("skipping {} spaces/tabs", n);
                rem = rem.sub(n);
                _line_progressed(n);
            }
        }

        _c4dbgpf("rem='{}'", rem);

        if(rem.begins_with(", "))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(2);
        }
        else if(rem.begins_with(','))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(1);
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("got a ': ' -- it's a map (as_child={})", start_as_child);
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(2);
        }
        else if(rem == ":" || rem.begins_with(":\"") || rem.begins_with(":'"))
        {
            if(rem == ":") { _c4dbgpf("got a ':' -- it's a map (as_child={})", start_as_child); }
            else { _c4dbgpf("got a '{}' -- it's a map (as_child={})", rem.first(2), start_as_child); }
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(1); // advance only 1
        }
        else if(rem.begins_with('}'))
        {
            if(!has_all(RMAP|FLOW))
            {
                _c4err("invalid token: not reading a map");
            }
            if(!has_all(SSCL))
            {
                _c4err("no scalar stored");
            }
            _append_key_val(saved_scalar);
            _stop_map();
            _line_progressed(1);
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
        }
        else if(rem.begins_with('#'))
        {
            _c4dbgpf("it's a comment: '{}'", rem);
            _scan_comment();
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(" ") || rem.begins_with("\t"))
        {
            size_t n = rem.first_not_of(" \t");
            if(n == npos)
                n = rem.len;
            _c4dbgpf("has {} spaces/tabs, skip...", n);
            _line_progressed(n);
            return true;
        }
        else if(rem.empty())
        {
            // nothing to do
        }
        else if(rem == "---" || rem.begins_with("--- "))
        {
            _c4dbgp("caught ---: starting doc");
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with('%'))
        {
            _c4dbgp("caught a directive: ignoring...");
            _line_progressed(rem.len);
            return true;
        }
        else
        {
            _c4err("parse error");
        }

        if( ! saved_scalar.empty())
        {
            _store_scalar(saved_scalar, is_quoted);
        }

        return true;
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL));
        csubstr scalar;
        size_t indentation = m_state->line_contents.indentation; // save
        bool is_quoted;
        if(_scan_scalar_unk(&scalar, &is_quoted))
        {
            _c4dbgpf("got a {} scalar", is_quoted ? "quoted" : "");
            rem = m_state->line_contents.rem;
            {
                size_t first = rem.first_not_of(" \t");
                if(first && first != npos)
                {
                    _c4dbgpf("skip {} whitespace characters", first);
                   _line_progressed(first);
                   rem = rem.sub(first);
                }
            }
            _store_scalar(scalar, is_quoted);
            if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
            {
                _c4dbgpf("got a ': ' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(2); // call this AFTER saving the indentation
            }
            else if(rem == ":")
            {
                _c4dbgpf("got a ':' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(1); // call this AFTER saving the indentation
            }
            else
            {
                // we still don't know whether it's a seq or a map
                // so just store the scalar
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            csubstr ws = rem.left_of(rem.first_not_of(" \t"));
            rem = rem.right_of(ws);
            if(has_all(RTOP) && rem.begins_with("---"))
            {
                _c4dbgp("there's a doc starting, and it's indented");
                _set_indentation(ws.len);
            }
            _c4dbgpf("skipping {} spaces/tabs", ws.len);
            _line_progressed(ws.len);
            return true;
        }
    }

    return false;
}